

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  char *pcVar4;
  ostream *poVar5;
  string *in_RDI;
  size_t unaff_retaddr;
  string *in_stack_00000008;
  ConsoleReporter *in_stack_00000010;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  iterator itEnd;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  it;
  Colour colourGuard;
  undefined4 in_stack_ffffffffffffff88;
  Code in_stack_ffffffffffffff8c;
  ostream *in_stack_ffffffffffffff90;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  *in_stack_ffffffffffffff98;
  ConsoleReporter *in_stack_ffffffffffffffb0;
  SourceLineInfo local_48 [2];
  SectionInfo *local_28;
  SectionInfo *local_20;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_18 [3];
  
  Option<Catch::TestCaseInfo>::operator->((Option<Catch::TestCaseInfo> *)&in_RDI[4].field_2);
  printOpenHeader(in_stack_ffffffffffffffb0,in_RDI);
  sVar2 = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                    ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                     &in_RDI[10]._M_string_length);
  if (1 < sVar2) {
    Colour::Colour((Colour *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    local_20 = (SectionInfo *)
               clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::begin
                         ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_18[0] = __gnu_cxx::
                  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                  ::operator+(in_stack_ffffffffffffff98,(difference_type)in_stack_ffffffffffffff90);
    local_28 = (SectionInfo *)
               clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::end
                         ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                          *)in_stack_ffffffffffffff90,
                         (__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator->(local_18);
      printHeaderString(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      __gnu_cxx::
      __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator++(local_18);
    }
    Colour::~Colour((Colour *)0x13730e);
  }
  pvVar3 = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::back
                     ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                      in_stack_ffffffffffffff90);
  local_48[0].file = (pvVar3->lineInfo).file;
  local_48[0].line = (pvVar3->lineInfo).line;
  bVar1 = SourceLineInfo::empty(local_48);
  if (!bVar1) {
    poVar5 = *(ostream **)((long)&in_RDI->field_2 + 8);
    pcVar4 = getLineOfChars<(char)45>();
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::operator<<(poVar5,'\n');
    Colour::Colour((Colour *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    poVar5 = Catch::operator<<(in_stack_ffffffffffffff90,
                               (SourceLineInfo *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::operator<<(poVar5,'\n');
    Colour::~Colour((Colour *)0x1373b4);
  }
  poVar5 = *(ostream **)((long)&in_RDI->field_2 + 8);
  pcVar4 = getLineOfChars<(char)46>();
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5,'\n');
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    if (!lineInfo.empty()) {
        stream << getLineOfChars<'-'>() << '\n';
        Colour colourGuard(Colour::FileName);
        stream << lineInfo << '\n';
    }
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}